

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strconv.c
# Opt level: O2

int jsonp_strtod(strbuffer_t *strbuffer,double *out)

{
  char cVar1;
  int iVar2;
  char *in_RAX;
  lconv *plVar3;
  char *pcVar4;
  int *piVar5;
  char *__s;
  double dVar6;
  char *end;
  
  end = in_RAX;
  plVar3 = localeconv();
  cVar1 = *plVar3->decimal_point;
  __s = strbuffer->value;
  if (cVar1 != '.') {
    pcVar4 = strchr(__s,0x2e);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = cVar1;
      __s = strbuffer->value;
    }
  }
  piVar5 = __errno_location();
  *piVar5 = 0;
  dVar6 = strtod(__s,&end);
  if (end == strbuffer->value + strbuffer->length) {
    if ((ABS(dVar6) == INFINITY) && (*piVar5 == 0x22)) {
      iVar2 = -1;
    }
    else {
      *out = dVar6;
      iVar2 = 0;
    }
    return iVar2;
  }
  __assert_fail("end == strbuffer->value + strbuffer->length",
                "/workspace/llm4binary/github/license_all_cmakelists_25/grimm-co[P]killerbeez-utils/jansson/strconv.c"
                ,0x55,"int jsonp_strtod(strbuffer_t *, double *)");
}

Assistant:

int jsonp_strtod(strbuffer_t *strbuffer, double *out)
{
    double value;
    char *end;

#if JSON_HAVE_LOCALECONV
    to_locale(strbuffer);
#endif

    errno = 0;
    value = strtod(strbuffer->value, &end);
    assert(end == strbuffer->value + strbuffer->length);

    if((value == HUGE_VAL || value == -HUGE_VAL) && errno == ERANGE) {
        /* Overflow */
        return -1;
    }

    *out = value;
    return 0;
}